

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.hpp
# Opt level: O2

void __thiscall OpenMD::InversePowerSeries::~InversePowerSeries(InversePowerSeries *this)

{
  (this->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__InversePowerSeries_002c7340;
  std::__cxx11::string::~string((string *)&this->name_);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&(this->simTypes_)._M_t);
  std::
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  ::~vector(&this->MixingMap);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->InversePowerSeriesTypes)._M_t);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }